

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgtransport.c
# Opt level: O3

int mg_raw_transport_recv(mg_transport *transport,char *buf,size_t len)

{
  int sock;
  ssize_t sVar1;
  ulong uVar2;
  
  if (len == 0) {
    return 0;
  }
  sock = *(int *)&transport[1].send;
  uVar2 = 0;
  while( true ) {
    sVar1 = mg_socket_receive(sock,buf + uVar2,(int)len - (int)uVar2);
    if (sVar1 == -1) {
      perror("mg_raw_transport_recv");
      return -1;
    }
    if (sVar1 == 0) break;
    uVar2 = uVar2 + sVar1;
    if (len <= uVar2) {
      return 0;
    }
  }
  mg_raw_transport_recv_cold_1();
  return -1;
}

Assistant:

int mg_raw_transport_recv(struct mg_transport *transport, char *buf,
                          size_t len) {
  int sockfd = ((mg_raw_transport *)transport)->sockfd;
  size_t total_received = 0;
  while (total_received < len) {
    ssize_t received_now =
        mg_socket_receive(sockfd, buf + total_received, len - total_received);
    if (received_now == 0) {
      // Server closed the connection.
      fprintf(stderr, "mg_raw_transport_recv: connection closed by server\n");
      return -1;
    }
    if (received_now == -1) {
      perror("mg_raw_transport_recv");
      return -1;
    }
    total_received += (size_t)received_now;
  }
  return 0;
}